

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O2

View * __thiscall r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input)

{
  _Object *this_00;
  Group *pGVar1;
  pointer ppGVar2;
  bool bVar3;
  SyncMode SVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  Group *this_01;
  View *now;
  ulong uVar8;
  long lVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  uint64_t uVar11;
  uint64_t uVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  HASTController *this_02;
  undefined4 extraout_var_03;
  View *pVVar13;
  _Mem *p_Var14;
  undefined4 extraout_var_04;
  Controller *c;
  float fVar15;
  Code *local_88;
  Code *local_78;
  string type;
  
  this_00 = (input->super_View).object.object;
  pVVar13 = input;
  this_01 = View::get_host(input);
  pGVar1 = *(this->output_groups).
            super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  now = (View *)(*Now)();
  SVar4 = View::get_sync(input);
  switch(SVar4) {
  case SYNC_ONCE:
    uVar8 = 0;
    while( true ) {
      uVar8 = uVar8 & 0xffff;
      ppGVar2 = (this->output_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->output_groups).
                        super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar8)
      break;
      pGVar1 = ppGVar2[uVar8];
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,input,true);
      (pVVar13->super_View).references[0] = (Code *)pGVar1;
      (pVVar13->super_View).references[1] = (input->super_View).references[0];
      fVar15 = (float)r_code::Atom::asFloat();
      uVar5 = Group::get_upr(this_01);
      uVar7 = Group::get_upr(pGVar1);
      lVar9 = r_code::Utils::GetGroupResilience((double)fVar15,(double)uVar5,(double)uVar7);
      r_code::Atom::Float((float)lVar9);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x38,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      p_Var14 = (_Mem *)r_code::Mem::Get();
      _Mem::inject(p_Var14,pVVar13);
      if (uVar8 == 0) {
        now = pVVar13;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    break;
  case SYNC_PERIODIC:
    bVar3 = _Fact::is_anti_fact((_Fact *)this_00);
    if (bVar3) {
      local_88 = (Code *)AntiFact::operator_new((AntiFact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar11 = Group::get_prev_upr_time(pGVar1,(uint64_t)now);
      uVar12 = Group::get_next_upr_time(pGVar1,(uint64_t)now);
      AntiFact::AntiFact((AntiFact *)local_88,(Code *)CONCAT44(extraout_var_01,iVar6),uVar11,uVar12,
                         1.0,1.0);
    }
    else {
      local_88 = (Code *)Fact::operator_new((Fact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar11 = Group::get_prev_upr_time(pGVar1,(uint64_t)now);
      uVar12 = Group::get_next_upr_time(pGVar1,(uint64_t)now);
      Fact::Fact((Fact *)local_88,(Code *)CONCAT44(extraout_var_04,iVar6),uVar11,uVar12,1.0,1.0);
    }
    uVar8 = 0;
    while( true ) {
      uVar8 = uVar8 & 0xffff;
      ppGVar2 = (this->output_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->output_groups).
                        super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar8)
      break;
      pGVar1 = ppGVar2[uVar8];
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,input,true);
      (pVVar13->super_View).references[0] = (Code *)pGVar1;
      (pVVar13->super_View).references[1] = (input->super_View).references[0];
      fVar15 = (float)r_code::Atom::asFloat();
      uVar5 = Group::get_upr(this_01);
      uVar7 = Group::get_upr(pGVar1);
      lVar9 = r_code::Utils::GetGroupResilience((double)fVar15,(double)uVar5,(double)uVar7);
      r_code::Atom::Float((float)lVar9);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x38,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      core::P<r_code::Code>::operator=(&(pVVar13->super_View).object,local_88);
      p_Var14 = (_Mem *)r_code::Mem::Get();
      _Mem::inject(p_Var14,pVVar13);
      if ((uVar8 == 0) && (now = pVVar13, this->_ctpx_on == true)) {
        p_Var14 = (_Mem *)r_code::Mem::Get();
        c = (Controller *)operator_new(0xd8);
        PASTController::PASTController((PASTController *)c,this,pVVar13);
        uVar5 = Group::get_upr(pGVar1);
        lVar9 = r_code::Utils::GetBasePeriod();
        _Mem::inject_null_program(p_Var14,c,pGVar1,(ulong)uVar5 * lVar9,true);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    break;
  case SYNC_HOLD:
    lVar9 = r_code::Utils::GetTimeTolerance();
    bVar3 = _Fact::is_anti_fact((_Fact *)this_00);
    if (bVar3) {
      local_88 = (Code *)AntiFact::operator_new((AntiFact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar5 = Group::get_upr(pGVar1);
      lVar10 = r_code::Utils::GetBasePeriod();
      uVar11 = (long)(now->super_View).references + lVar9 * 2 + -0x10;
      AntiFact::AntiFact((AntiFact *)local_88,(Code *)CONCAT44(extraout_var,iVar6),uVar11,
                         lVar10 * (long)(ulong)uVar5 + uVar11,1.0,1.0);
      now = (View *)(ulong)uVar5;
    }
    else {
      local_88 = (Code *)Fact::operator_new((Fact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar5 = Group::get_upr(pGVar1);
      lVar10 = r_code::Utils::GetBasePeriod();
      uVar11 = (long)(now->super_View).references + lVar9 * 2 + -0x10;
      Fact::Fact((Fact *)local_88,(Code *)CONCAT44(extraout_var_02,iVar6),uVar11,
                 lVar10 * (long)(ulong)uVar5 + uVar11,1.0,1.0);
      now = (View *)(ulong)uVar5;
    }
    uVar8 = 0;
    while( true ) {
      uVar8 = uVar8 & 0xffff;
      ppGVar2 = (this->output_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->output_groups).
                        super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar8)
      break;
      pGVar1 = ppGVar2[uVar8];
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,input,true);
      (pVVar13->super_View).references[0] = (Code *)pGVar1;
      (pVVar13->super_View).references[1] = (input->super_View).references[0];
      r_code::Atom::Float(0.0);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x2c,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      fVar15 = (float)r_code::Atom::asFloat();
      uVar5 = Group::get_upr(this_01);
      uVar7 = Group::get_upr(pGVar1);
      lVar9 = r_code::Utils::GetGroupResilience((double)fVar15,(double)uVar5,(double)uVar7);
      r_code::Atom::Float((float)lVar9);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x38,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      core::P<r_code::Code>::operator=(&(pVVar13->super_View).object,local_88);
      p_Var14 = (_Mem *)r_code::Mem::Get();
      _Mem::inject(p_Var14,pVVar13);
      if ((uVar8 == 0) && (now = pVVar13, this->_ctpx_on == true)) {
        p_Var14 = (_Mem *)r_code::Mem::Get();
        this_02 = (HASTController *)operator_new(0xe0);
        HASTController::HASTController(this_02,this,pVVar13,(_Fact *)this_00);
        uVar5 = Group::get_upr(pGVar1);
        lVar9 = r_code::Utils::GetBasePeriod();
        _Mem::inject_null_program(p_Var14,(Controller *)this_02,pGVar1,(ulong)uVar5 * lVar9,true);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    break;
  case SYNC_AXIOM:
    bVar3 = _Fact::is_anti_fact((_Fact *)this_00);
    if (bVar3) {
      local_78 = (Code *)AntiFact::operator_new((AntiFact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar11 = Group::get_prev_upr_time(pGVar1,(uint64_t)now);
      uVar12 = Group::get_next_upr_time(pGVar1,(uint64_t)now);
      AntiFact::AntiFact((AntiFact *)local_78,(Code *)CONCAT44(extraout_var_00,iVar6),uVar11,uVar12,
                         1.0,1.0);
    }
    else {
      local_78 = (Code *)Fact::operator_new((Fact *)0x150,(size_t)pVVar13);
      iVar6 = (*(((LObject *)&this_00->_vptr__Object)->
                super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.
                super__Object._vptr__Object[9])(this_00,0);
      uVar11 = Group::get_prev_upr_time(pGVar1,(uint64_t)now);
      uVar12 = Group::get_next_upr_time(pGVar1,(uint64_t)now);
      Fact::Fact((Fact *)local_78,(Code *)CONCAT44(extraout_var_03,iVar6),uVar11,uVar12,1.0,1.0);
    }
    uVar8 = 0;
    while( true ) {
      uVar8 = uVar8 & 0xffff;
      ppGVar2 = (this->output_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->output_groups).
                        super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar8)
      break;
      pGVar1 = ppGVar2[uVar8];
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,input,true);
      (pVVar13->super_View).references[0] = (Code *)pGVar1;
      (pVVar13->super_View).references[1] = (input->super_View).references[0];
      r_code::Atom::Float(4.0);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x2c,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      r_code::Atom::Float(1.0);
      r_code::Atom::operator=((Atom *)&(pVVar13->super_View).field_0x38,(Atom *)&type);
      r_code::Atom::~Atom((Atom *)&type);
      core::P<r_code::Code>::operator=(&(pVVar13->super_View).object,local_78);
      p_Var14 = (_Mem *)r_code::Mem::Get();
      _Mem::inject(p_Var14,pVVar13);
      if (uVar8 == 0) {
        now = pVVar13;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    break;
  case SYNC_ONCE_AXIOM:
    std::operator<<((ostream *)&std::cerr,"Unhandled sync once axiom");
    exit(1);
  }
  if (this->_trace_injections == true) {
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    type.field_2._M_local_buf[0] = '\0';
    SVar4 = View::get_sync(input);
    if (SVar4 < (SYNC_ONCE_AXIOM|SYNC_PERIODIC)) {
      std::__cxx11::string::assign((char *)&type);
    }
    std::__cxx11::string::~string((string *)&type);
  }
  return now;
}

Assistant:

inline View *AutoFocusController::inject_input(View *input)
{
    _Fact *input_fact = (_Fact *)input->object;
    Group *origin = input->get_host();
    Group *ref_group = output_groups[0];
    uint64_t now = Now();
    View *primary_view;
    _Fact *copy;

    switch (input->get_sync()) {
    case View::SYNC_ONCE: // no copy, morph res; N.B.: cmds are sync_once.
        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;

    case View::SYNC_PERIODIC: // inject a copy, morph res, add a controller.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new PASTController(this, view), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;

    case View::SYNC_HOLD: { // inject a copy, add a controller, sync_once, morph res, after=now+time_tolerance (de-sync as it can have the same effect as a cmd), before=now+output_grp.upr+time_tolerance.
        uint64_t offset = 2 * Utils::GetTimeTolerance();

        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE);
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new HASTController(this, view, input_fact), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;
    }

    case View::SYNC_AXIOM: // inject a copy, sync_once, res=1, fact.before=next output_grp upr.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE_AXIOM);
            view->code(VIEW_RES) = Atom::Float(1);
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;
    case View::SYNC_ONCE_AXIOM:
        std::cerr << "Unhandled sync once axiom";
        exit(1);
        break;
    }

    if (_trace_injections) {
        std::string type;

        switch (input->get_sync()) {
        case View::SYNC_HOLD:
            type = "(hold)";
            break;

        case View::SYNC_ONCE:
            type = "(once)";
            break;

        case View::SYNC_PERIODIC:
            type = "(periodic)";
            break;

        case View::SYNC_AXIOM:
            type = "(axiom)";
            break;

        case View::SYNC_ONCE_AXIOM:
            type = "(once axiom)";
            break;
        }

        //    ::debug("auto_focus") << Utils::RelativeTime(Now()) << "A/F ->" << input->object->get_oid() << "|" << primary_view->object->get_oid() << type;
    }

    return primary_view;
}